

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O0

QCursorData *
QCursorData::setBitmap(QBitmap *bitmap,QBitmap *mask,int hotX,int hotY,qreal devicePixelRatio)

{
  int iVar1;
  QBitmap *pQVar2;
  int in_ECX;
  int in_EDX;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar3;
  QCursorData *d;
  QCursorData *c;
  QSize *in_stack_ffffffffffffff58;
  QCursorData *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  QPixmap *in_stack_ffffffffffffff70;
  bool local_71;
  QCursorData *local_40;
  char local_38 [32];
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  initialize();
  iVar1 = QPixmap::depth((QPixmap *)in_stack_ffffffffffffff60);
  local_71 = true;
  if (iVar1 == 1) {
    iVar1 = QPixmap::depth((QPixmap *)in_stack_ffffffffffffff60);
    local_71 = true;
    if (iVar1 == 1) {
      local_10 = QPixmap::size(in_stack_ffffffffffffff70);
      local_18 = QPixmap::size(in_stack_ffffffffffffff70);
      local_71 = ::operator!=((QSize *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  if (local_71 == false) {
    local_40 = (QCursorData *)operator_new(0x38);
    QCursorData(in_stack_ffffffffffffff60,(CursorShape)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    pQVar2 = (QBitmap *)operator_new(0x18);
    QBitmap::QBitmap((QBitmap *)in_stack_ffffffffffffff60,(QBitmap *)in_stack_ffffffffffffff58);
    local_40->bm = pQVar2;
    pQVar2 = (QBitmap *)operator_new(0x18);
    QBitmap::QBitmap((QBitmap *)in_stack_ffffffffffffff60,(QBitmap *)in_stack_ffffffffffffff58);
    local_40->bmm = pQVar2;
    local_40->cshape = BitmapCursor;
    if (in_EDX < 0) {
      iVar1 = QPixmap::width((QPixmap *)in_stack_ffffffffffffff60);
      dVar3 = (double)(iVar1 / 2) / in_XMM0_Qa;
    }
    else {
      dVar3 = (double)in_EDX;
    }
    local_40->hx = (short)(int)dVar3;
    if (in_ECX < 0) {
      iVar1 = QPixmap::height((QPixmap *)in_stack_ffffffffffffff60);
      dVar3 = (double)(iVar1 / 2) / in_XMM0_Qa;
    }
    else {
      dVar3 = (double)in_ECX;
    }
    local_40->hy = (short)(int)dVar3;
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(char *)in_stack_ffffffffffffff58);
    QMessageLogger::warning(local_38,"QCursor: Cannot create bitmap cursor; invalid bitmap(s)");
    local_40 = qt_cursorTable[0];
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x341c7a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QCursorData *QCursorData::setBitmap(const QBitmap &bitmap, const QBitmap &mask, int hotX, int hotY, qreal devicePixelRatio)
{
    QCursorData::initialize();
    if (bitmap.depth() != 1 || mask.depth() != 1 || bitmap.size() != mask.size()) {
        qWarning("QCursor: Cannot create bitmap cursor; invalid bitmap(s)");
        QCursorData *c = qt_cursorTable[0];
        c->ref.ref();
        return c;
    }
    QCursorData *d = new QCursorData;
    d->bm  = new QBitmap(bitmap);
    d->bmm = new QBitmap(mask);
    d->cshape = Qt::BitmapCursor;
    d->hx = hotX >= 0 ? hotX : bitmap.width() / 2 / devicePixelRatio;
    d->hy = hotY >= 0 ? hotY : bitmap.height() / 2 / devicePixelRatio;

    return d;
}